

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall Frame::pushIntoOperandStack(Frame *this,Value operand)

{
  value_type local_10;
  
  local_10.data = operand.data;
  local_10._0_8_ = operand._0_8_;
  std::deque<Value,_std::allocator<Value>_>::push_back(&(this->_operandStack).c,&local_10);
  return;
}

Assistant:

void Frame::pushIntoOperandStack(Value operand) {
    _operandStack.push(operand);
}